

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

ssize_t __thiscall DistanceGraph::write(DistanceGraph *this,int __fd,void *__buf,size_t __n)

{
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  *vv;
  long lVar1;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  ofstream *poVar2;
  uint64_t s;
  ofstream *ofs;
  
  poVar2 = (ofstream *)CONCAT44(in_register_00000034,__fd);
  vv = (vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
        *)std::__cxx11::string::size();
  std::ostream::write((char *)poVar2,(long)&stack0xffffffffffffffe8);
  ofs = poVar2;
  lVar1 = std::__cxx11::string::data();
  std::__cxx11::string::size();
  std::ostream::write((char *)poVar2,lVar1);
  sdglib::write_flat_vectorvector<Link>(ofs,vv);
  return extraout_RAX;
}

Assistant:

void DistanceGraph::write(std::ofstream &output_file) {
    uint64_t s=name.size();
    output_file.write((char *) &s,sizeof(s));
    output_file.write((char *)name.data(),name.size());
    sdglib::write_flat_vectorvector(output_file, links);
}